

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

void __thiscall QListWidget::setCurrentRow(QListWidget *this,int row)

{
  QListWidgetPrivate *pQVar1;
  QListModel *pQVar2;
  QItemSelectionModel *pQVar3;
  undefined4 in_ESI;
  long in_FS_OFFSET;
  QListWidgetPrivate *d;
  QModelIndex index;
  SelectionFlag in_stack_ffffffffffffff6c;
  QAbstractItemView *in_stack_ffffffffffffff70;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined1 local_38 [24];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QListWidget *)0x89dfb4);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = QListWidgetPrivate::listModel((QListWidgetPrivate *)0x89dfed);
  QModelIndex::QModelIndex((QModelIndex *)0x89e004);
  (**(code **)(*(long *)pQVar2 + 0x60))(&local_20,pQVar2,in_ESI,0,local_38);
  if ((pQVar1->super_QListViewPrivate).super_QAbstractItemViewPrivate.selectionMode ==
      SingleSelection) {
    pQVar3 = QAbstractItemView::selectionModel(in_stack_ffffffffffffff70);
    QFlags<QItemSelectionModel::SelectionFlag>::QFlags
              ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c);
    (**(code **)(*(long *)pQVar3 + 0x60))(pQVar3,&local_20,local_3c);
  }
  else if ((pQVar1->super_QListViewPrivate).super_QAbstractItemViewPrivate.selectionMode ==
           NoSelection) {
    pQVar3 = QAbstractItemView::selectionModel(in_stack_ffffffffffffff70);
    QFlags<QItemSelectionModel::SelectionFlag>::QFlags
              ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c);
    (**(code **)(*(long *)pQVar3 + 0x60))(pQVar3,&local_20,local_40);
  }
  else {
    pQVar3 = QAbstractItemView::selectionModel(in_stack_ffffffffffffff70);
    QFlags<QItemSelectionModel::SelectionFlag>::QFlags
              ((QFlags<QItemSelectionModel::SelectionFlag> *)pQVar3,in_stack_ffffffffffffff6c);
    (**(code **)(*(long *)pQVar3 + 0x60))(pQVar3,&local_20,local_44);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListWidget::setCurrentRow(int row)
{
    Q_D(QListWidget);
    QModelIndex index = d->listModel()->index(row);
    if (d->selectionMode == SingleSelection)
        selectionModel()->setCurrentIndex(index, QItemSelectionModel::ClearAndSelect);
    else if (d->selectionMode == NoSelection)
        selectionModel()->setCurrentIndex(index, QItemSelectionModel::NoUpdate);
    else
        selectionModel()->setCurrentIndex(index, QItemSelectionModel::SelectCurrent);
}